

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O2

uchar char_name_to_char(string *name)

{
  size_type sVar1;
  uchar *puVar2;
  string local_50;
  string local_30;
  
  if (name->_M_string_length == 1) {
    puVar2 = (uchar *)(name->_M_dataplus)._M_p;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)name);
    normalize_char_name(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)name,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::count(&charnames_abi_cxx11_,name);
    if (sVar1 == 0) {
      return '\0';
    }
    puVar2 = (uchar *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                      ::at(&charnames_abi_cxx11_,name);
  }
  return *puVar2;
}

Assistant:

unsigned char char_name_to_char(std::string name)
{
    if(name.length() == 1)
        return name[0];
    name = normalize_char_name(name);
    if(charnames.count(name))
        return charnames.at(name);
    return 0;
}